

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int exprSrcCount(Walker *pWalker,Expr *pExpr)

{
  int iVar1;
  SrcCount *pSVar2;
  int *piVar3;
  long lVar4;
  
  if ((pExpr->op | 2) == 0x9a) {
    pSVar2 = (pWalker->u).pSrcCount;
    lVar4 = -1;
    piVar3 = &pSVar2->pSrc->a[0].iCursor;
    do {
      lVar4 = lVar4 + 1;
      if (pSVar2->pSrc->nSrc <= lVar4) {
        pSVar2->nOther = pSVar2->nOther + 1;
        return 0;
      }
      iVar1 = *piVar3;
      piVar3 = piVar3 + 0x1a;
    } while (pExpr->iTable != iVar1);
    pSVar2->nThis = pSVar2->nThis + 1;
  }
  return 0;
}

Assistant:

static int exprSrcCount(Walker *pWalker, Expr *pExpr){
  /* The NEVER() on the second term is because sqlite3FunctionUsesThisSrc()
  ** is always called before sqlite3ExprAnalyzeAggregates() and so the
  ** TK_COLUMNs have not yet been converted into TK_AGG_COLUMN.  If
  ** sqlite3FunctionUsesThisSrc() is used differently in the future, the
  ** NEVER() will need to be removed. */
  if( pExpr->op==TK_COLUMN || NEVER(pExpr->op==TK_AGG_COLUMN) ){
    int i;
    struct SrcCount *p = pWalker->u.pSrcCount;
    SrcList *pSrc = p->pSrc;
    for(i=0; i<pSrc->nSrc; i++){
      if( pExpr->iTable==pSrc->a[i].iCursor ) break;
    }
    if( i<pSrc->nSrc ){
      p->nThis++;
    }else{
      p->nOther++;
    }
  }
  return WRC_Continue;
}